

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_namespace::translate
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  compiler_type *this_00;
  token_base *tbp;
  _Elt_pointer pdVar1;
  int iVar2;
  statement_namespace *this_01;
  const_reference pptVar3;
  token_base **pptVar4;
  _Elt_pointer pptVar5;
  compile_error *this_02;
  _Elt_pointer ppsVar6;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *ast;
  _Map_pointer pppsVar7;
  _Elt_pointer ppsVar8;
  allocator_type local_199;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_198;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_138;
  _Self local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_e8._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_e8._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_e8._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_50,&local_e8,1);
  local_78._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_78._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_138,&local_50,&local_78,&local_199);
  ast = &local_138;
  compiler_type::translate(this_00,ast,&body);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_138);
  ppsVar6 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  pppsVar7 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppsVar8 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  do {
    if (ppsVar8 ==
        body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      this_01 = (statement_namespace *)
                statement_base::operator_new((statement_base *)0x90,(size_t)ast);
      pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          ((raw->
                           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                           )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
      local_138.
      super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(*pptVar3)[1]._vptr_token_base;
      pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_138);
      tbp = *pptVar4;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
                 &body);
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_198,
                 &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
      pdVar1 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar5 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar5 ==
          (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar5 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_namespace::statement_namespace
                (this_01,tbp,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
                 (context_t *)&local_198,pptVar5[-1]);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_c8);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&body.
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
      return &this_01->super_statement_base;
    }
    iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
    if (iVar2 != 2) {
      iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
      if (iVar2 != 4) {
        iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
        if (iVar2 != 7) {
          iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
          if (iVar2 != 0x17) {
            iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
            if (iVar2 != 6) {
              iVar2 = (*(*ppsVar8)->_vptr_statement_base[2])();
              if (iVar2 != 0x16) {
                this_02 = (compile_error *)__cxa_allocate_exception(0x28);
                std::__cxx11::string::string
                          ((string *)&local_138,"Unexpected statement in namespace definition.",
                           (allocator *)&local_e8);
                compile_error::compile_error(this_02,(string *)&local_138);
                __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
              }
            }
          }
        }
      }
    }
    ppsVar8 = ppsVar8 + 1;
    if (ppsVar8 == ppsVar6) {
      ppsVar8 = pppsVar7[1];
      pppsVar7 = pppsVar7 + 1;
      ppsVar6 = ppsVar8 + 0x40;
    }
  } while( true );
}

Assistant:

statement_base *
	method_namespace::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body)
			if (ptr->get_type() != statement_types::import_ && ptr->get_type() != statement_types::involve_ &&
			        ptr->get_type() != statement_types::var_ && ptr->get_type() != statement_types::function_ &&
			        ptr->get_type() != statement_types::namespace_ && ptr->get_type() != statement_types::struct_)
				throw compile_error("Unexpected statement in namespace definition.");
		return new statement_namespace(static_cast<token_expr *>(raw.front().at(1))->get_tree().root().data(), body,
		                               context, raw.front().back());
	}